

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::operator+=(path *this,value_type *x)

{
  path *ppVar1;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,x,&local_31);
  ppVar1 = concat<std::__cxx11::string>(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return ppVar1;
}

Assistant:

GHC_INLINE path& path::operator+=(const value_type* x)
{
    return concat(string_type(x));
}